

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanIdentifierContinue
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,bool identifyKwds,bool fHasEscape,
          bool fHasMultiChar,EncodedCharPtr pchMin,EncodedCharPtr p,EncodedCharPtr *pp)

{
  UTF8EncodingPolicyBase<false> *this_00;
  EncodedCharPtr last;
  size_t sVar1;
  Token *pTVar2;
  Parser *this_01;
  LPCOLESTR prgch;
  code *pcVar3;
  EncodedCharPtr puVar4;
  uint uVar5;
  bool bVar6;
  OLECHAR OVar7;
  BOOL BVar8;
  uint32 cch;
  tokens tVar9;
  undefined4 *puVar10;
  IdentPtr this_02;
  byte bVar11;
  undefined7 in_register_00000011;
  EncodedCharPtr local_48;
  EncodedCharPtr p_local;
  codepoint_t local_38;
  bool local_31;
  codepoint_t codePoint;
  bool fHasMultiChar_local;
  
  p_local._4_4_ = (uint)CONCAT71(in_register_00000011,fHasEscape);
  last = this->m_pchLast;
  local_48 = p;
  local_31 = fHasMultiChar;
  BVar8 = FastIdentifierContinue(this,&local_48,last);
  if (BVar8 == 0) {
    this_00 = &this->super_UTF8EncodingPolicyBase<false>;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      puVar4 = local_48;
      local_38 = 0xffffffff;
      sVar1 = this_00->m_cMultiUnits;
      if (local_48 < last) {
        OVar7 = UTF8EncodingPolicyBase<false>::ReadFull<true>(this_00,&local_48,last);
        p_local._0_4_ = (uint)(ushort)OVar7;
        if ((uint)p_local < 0x80) {
          if ((ushort)OVar7 == 0x5c) {
            bVar6 = TryReadEscape(this,&local_48,last,(codepoint_t *)&p_local);
            p_local._4_4_ = p_local._4_4_ & 0xff;
            if (bVar6) {
              p_local._4_4_ = 1;
            }
          }
        }
        else {
          local_31 = true;
          if ((this->es6UnicodeMode == true) &&
             (bVar6 = Js::NumberUtilities::IsSurrogateLowerPart((uint)(ushort)OVar7), bVar6)) {
            bVar6 = TryReadCodePointRest<true>
                              (this,(uint)p_local,&local_48,last,&local_38,&local_31);
            goto LAB_00f15f87;
          }
        }
        local_38 = (uint)p_local;
        bVar6 = true;
      }
      else {
        bVar6 = false;
      }
LAB_00f15f87:
      if (bVar6 == false) {
LAB_00f16028:
        this_00->m_cMultiUnits = sVar1;
        local_48 = puVar4;
        break;
      }
      if (0x10ffff < local_38) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x1e3,"(codePoint < 0x110000u)","codePoint < 0x110000u");
        if (!bVar6) goto LAB_00f163a0;
        *puVar10 = 0;
      }
      bVar6 = Js::CharClassifier::IsIdContinue(this->charClassifier,local_38);
      if (!bVar6) goto LAB_00f16028;
      BVar8 = FastIdentifierContinue(this,&local_48,last);
    } while (BVar8 == 0);
  }
  uVar5 = p_local._4_4_;
  bVar11 = (byte)p_local._4_4_;
  this->field_0x508 = (this->field_0x508 & 0xef) + bVar11 * '\x10';
  if ((ulong)((long)pchMin - (long)local_48) < 0xffffffff80000001) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x1f2,"(p - pchMin > 0 && p - pchMin <= 2147483647L)",
                       "p - pchMin > 0 && p - pchMin <= LONG_MAX");
    if (!bVar6) goto LAB_00f163a0;
    *puVar10 = 0;
  }
  *pp = local_48;
  if (!identifyKwds) {
    return tkID;
  }
  if ((local_31 == false) && ((uVar5 & 1) == 0)) {
    cch = UnescapeToTempBuf(this,pchMin,local_48);
    prgch = (this->m_tempChBuf).m_prgch;
    if (this->m_parser == (Parser *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = Parser::IsStrictMode(this->m_parser);
    }
    tVar9 = Ident::TkFromNameLen(prgch,cch,bVar6);
    if (tVar9 == tkAWAIT) {
      if ((this->m_fAwaitIsKeywordRegion == false) && ((this->field_0x508 & 1) == 0))
      goto LAB_00f162b4;
    }
    else if ((tVar9 == tkID) ||
            (((tVar9 == tkYIELD && (this->m_fYieldIsKeywordRegion == false)) &&
             ((this->m_parser == (Parser *)0x0 ||
              (bVar6 = Parser::IsStrictMode(this->m_parser), !bVar6)))))) goto LAB_00f162b4;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x204,
                       "(tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()))"
                       ,
                       "tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword())"
                      );
    if (bVar6) {
      *puVar10 = 0;
LAB_00f162b4:
      pTVar2 = this->m_ptoken;
      (pTVar2->u).field_0.pid = (IdentPtr)0x0;
      (pTVar2->u).field_0.pchMin = (char *)pchMin;
      (pTVar2->u).field_0.length = (int)local_48 - (int)pchMin;
      return tkID;
    }
  }
  else {
    this_02 = PidOfIdentiferAt(this,pchMin,local_48,(bool)(bVar11 & 1),local_31);
    pTVar2 = this->m_ptoken;
    (pTVar2->u).field_0.pid = this_02;
    (pTVar2->u).field_0.pchMin = (char *)0x0;
    this_01 = this->m_parser;
    if ((uVar5 & 1) != 0) {
      if (this_01 == (Parser *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = Parser::IsStrictMode(this_01);
      }
      tVar9 = Ident::Tk(this_02,bVar6);
      if (tVar9 == tkAWAIT) {
        tVar9 = tkID;
        if ((this->field_0x508 & 1) != 0) {
          tVar9 = tkNone;
        }
        if (this->m_fAwaitIsKeywordRegion == false) {
          return tVar9;
        }
        return tkNone;
      }
      if (tVar9 == tkID) {
        return tkID;
      }
      if ((tVar9 == tkYIELD) && (this->m_fYieldIsKeywordRegion == false)) {
        if (this->m_parser == (Parser *)0x0) {
          return tkID;
        }
        bVar6 = Parser::IsStrictMode(this->m_parser);
        if (!bVar6) {
          return tkID;
        }
      }
      return tkNone;
    }
    if (this_01 == (Parser *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = Parser::IsStrictMode(this_01);
    }
    tVar9 = Ident::Tk(this_02,bVar6);
    if (tVar9 == tkID) {
      return tkID;
    }
    if (this->m_parser == (Parser *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = Parser::IsStrictMode(this->m_parser);
    }
    tVar9 = Ident::Tk(this_02,bVar6);
    if ((tVar9 == tkYIELD) && (this->m_fYieldIsKeywordRegion == false)) {
      if (this->m_parser == (Parser *)0x0) {
        return tkID;
      }
      bVar6 = Parser::IsStrictMode(this->m_parser);
      if (!bVar6) {
        return tkID;
      }
    }
    if (this->m_parser == (Parser *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = Parser::IsStrictMode(this->m_parser);
    }
    tVar9 = Ident::Tk(this_02,bVar6);
    if (((tVar9 == tkAWAIT) && (this->m_fAwaitIsKeywordRegion == false)) &&
       ((this->field_0x508 & 1) == 0)) {
      return tkID;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x215,
                       "(pid->Tk(IsStrictMode()) == tkID || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword()) || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword()))"
                       ,
                       "pid->Tk(IsStrictMode()) == tkID || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword()) || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword())"
                      );
    if (bVar6) {
      *puVar10 = 0;
      return tkID;
    }
  }
LAB_00f163a0:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanIdentifierContinue(bool identifyKwds, bool fHasEscape, bool fHasMultiChar,
    EncodedCharPtr pchMin, EncodedCharPtr p, EncodedCharPtr *pp)
{
    EncodedCharPtr last = m_pchLast;

    while (true)
    {
        // Fast path for utf8, non-multi unit char and not escape
        if (FastIdentifierContinue(p, last))
        {
            break;
        }

        // Slow path that has to deal with multi unit encoding
        codepoint_t codePoint = INVALID_CODEPOINT;
        EncodedCharPtr pchBeforeLast = p;
        size_t multiUnitsBeforeLast = this->m_cMultiUnits;
        if (TryReadCodePoint<true>(p, last, &codePoint, &fHasEscape, &fHasMultiChar))
        {
            Assert(codePoint < 0x110000u);
            if (charClassifier->IsIdContinue(codePoint))
            {
                continue;
            }
        }

        // Put back the last character
        p = pchBeforeLast;
        this->RestoreMultiUnits(multiUnitsBeforeLast);
        break;
    }

    m_lastIdentifierHasEscape = fHasEscape;

    Assert(p - pchMin > 0 && p - pchMin <= LONG_MAX);

    *pp = p;

    if (!identifyKwds)
    {
        return tkID;
    }

    // UTF16 Scanner are only for syntax coloring, so it shouldn't come here.
    if (EncodingPolicy::MultiUnitEncoding && !fHasMultiChar && !fHasEscape)
    {
        Assert(sizeof(EncodedChar) == 1);

        // If there are no escape, that the main scan loop would have found the keyword already
        // So we can just assume it is an ID
        DebugOnly(int32 cch = UnescapeToTempBuf(pchMin, p));
        DebugOnly(tokens tk = Ident::TkFromNameLen(m_tempChBuf.m_prgch, cch, IsStrictMode()));
        Assert(tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()));

        m_ptoken->SetIdentifier(reinterpret_cast<const char *>(pchMin), (int32)(p - pchMin));
        return tkID;
    }

    IdentPtr pid = PidOfIdentiferAt(pchMin, p, fHasEscape, fHasMultiChar);
    m_ptoken->SetIdentifier(pid);

    if (!fHasEscape)
    {
        // If it doesn't have escape, then Scan() should have taken care of keywords (except
        // yield if m_fYieldIsKeyword is false, in which case yield is treated as an identifier, and except
        // await if m_fAwaitIsKeyword is false, in which case await is treated as an identifier).
        // We don't have to check if the name is reserved word and return it as an Identifier
        Assert(pid->Tk(IsStrictMode()) == tkID
            || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword())
            || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword()));
        return tkID;
    }
    tokens tk = pid->Tk(IsStrictMode());
    return tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()) ? tkID : tkNone;
}